

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitNativeX86_common.c
# Opt level: O0

sljit_s32 emit_clz(sljit_compiler *compiler,sljit_s32 op_flags,sljit_s32 dst,sljit_sw dstw,
                  sljit_s32 src,sljit_sw srcw)

{
  int iVar1;
  sljit_s32 sVar2;
  sljit_u8 *psVar3;
  sljit_s32 local_48;
  sljit_s32 dst_r;
  sljit_u8 *inst;
  sljit_sw srcw_local;
  sljit_s32 src_local;
  sljit_sw dstw_local;
  sljit_s32 dst_local;
  sljit_s32 op_flags_local;
  sljit_compiler *compiler_local;
  
  if (cpu_has_cmov == -1) {
    get_cpu_features();
  }
  local_48 = dst;
  if (0x3f < dst) {
    local_48 = 0xf;
  }
  psVar3 = emit_x86_instruction(compiler,2,local_48,0,src,srcw);
  if (psVar3 == (sljit_u8 *)0x0) {
    return compiler->error;
  }
  *psVar3 = '\x0f';
  psVar3[1] = 0xbd;
  if (cpu_has_cmov == 0) {
    iVar1 = 0x3f;
    if ((op_flags & 0x100U) == 0) {
      iVar1 = 0x7f;
    }
    sVar2 = sljit_emit_cmov_generic(compiler,0,local_48,0x40,(long)iVar1);
    if (sVar2 != 0) {
      return compiler->error;
    }
  }
  else {
    iVar1 = 0x3f;
    if ((op_flags & 0x100U) == 0) {
      iVar1 = 0x7f;
    }
    sVar2 = emit_mov(compiler,0x10,0,0x40,(long)iVar1);
    if (sVar2 != 0) {
      return compiler->error;
    }
    psVar3 = emit_x86_instruction(compiler,2,local_48,0,0x10,0);
    if (psVar3 == (sljit_u8 *)0x0) {
      return compiler->error;
    }
    *psVar3 = '\x0f';
    psVar3[1] = 'D';
  }
  iVar1 = 0x1f;
  if ((op_flags & 0x100U) == 0) {
    iVar1 = 0x3f;
  }
  psVar3 = emit_x86_instruction(compiler,0x11,0x40,(long)iVar1,local_48,0);
  if (psVar3 == (sljit_u8 *)0x0) {
    compiler_local._4_4_ = compiler->error;
  }
  else {
    psVar3[1] = psVar3[1] | 0x30;
    if (((dst & 0x80U) == 0) || (sVar2 = emit_mov(compiler,dst,dstw,0xf,0), sVar2 == 0)) {
      compiler_local._4_4_ = 0;
    }
    else {
      compiler_local._4_4_ = compiler->error;
    }
  }
  return compiler_local._4_4_;
}

Assistant:

static sljit_s32 emit_clz(struct sljit_compiler *compiler, sljit_s32 op_flags,
	sljit_s32 dst, sljit_sw dstw,
	sljit_s32 src, sljit_sw srcw)
{
	sljit_u8* inst;
	sljit_s32 dst_r;

	SLJIT_UNUSED_ARG(op_flags);

	if (cpu_has_cmov == -1)
		get_cpu_features();

	dst_r = FAST_IS_REG(dst) ? dst : TMP_REG1;

	inst = emit_x86_instruction(compiler, 2, dst_r, 0, src, srcw);
	FAIL_IF(!inst);
	*inst++ = GROUP_0F;
	*inst = BSR_r_rm;

#if (defined SLJIT_CONFIG_X86_32 && SLJIT_CONFIG_X86_32)
	if (cpu_has_cmov) {
		if (dst_r != TMP_REG1) {
			EMIT_MOV(compiler, TMP_REG1, 0, SLJIT_IMM, 32 + 31);
			inst = emit_x86_instruction(compiler, 2, dst_r, 0, TMP_REG1, 0);
		}
		else
			inst = emit_x86_instruction(compiler, 2, dst_r, 0, SLJIT_MEM0(), (sljit_sw)&emit_clz_arg);

		FAIL_IF(!inst);
		*inst++ = GROUP_0F;
		*inst = CMOVE_r_rm;
	}
	else
		FAIL_IF(sljit_emit_cmov_generic(compiler, SLJIT_EQUAL, dst_r, SLJIT_IMM, 32 + 31));

	inst = emit_x86_instruction(compiler, 1 | EX86_BIN_INS, SLJIT_IMM, 31, dst_r, 0);
#else
	if (cpu_has_cmov) {
		EMIT_MOV(compiler, TMP_REG2, 0, SLJIT_IMM, !(op_flags & SLJIT_I32_OP) ? (64 + 63) : (32 + 31));

		inst = emit_x86_instruction(compiler, 2, dst_r, 0, TMP_REG2, 0);
		FAIL_IF(!inst);
		*inst++ = GROUP_0F;
		*inst = CMOVE_r_rm;
	}
	else
		FAIL_IF(sljit_emit_cmov_generic(compiler, SLJIT_EQUAL, dst_r, SLJIT_IMM, !(op_flags & SLJIT_I32_OP) ? (64 + 63) : (32 + 31)));

	inst = emit_x86_instruction(compiler, 1 | EX86_BIN_INS, SLJIT_IMM, !(op_flags & SLJIT_I32_OP) ? 63 : 31, dst_r, 0);
#endif

	FAIL_IF(!inst);
	*(inst + 1) |= XOR;

	if (dst & SLJIT_MEM)
		EMIT_MOV(compiler, dst, dstw, TMP_REG1, 0);
	return SLJIT_SUCCESS;
}